

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::NodeRef::set_key(NodeRef *this,csubstr key)

{
  pfn_error p_Var1;
  Location LVar2;
  csubstr key_00;
  Location loc;
  bool bVar3;
  error_flags eVar4;
  NodeRef *in_RDI;
  char msg [43];
  size_t in_stack_ffffffffffffff08;
  type_bits in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  Tree *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  Location *in_stack_ffffffffffffff30;
  char (*in_stack_ffffffffffffff60) [32];
  type_bits tStack_98;
  char *in_stack_ffffffffffffff70;
  Tree *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  csubstr in_stack_ffffffffffffff88;
  size_t sStack_38;
  char *local_30;
  Tree *pTStack_28;
  char *local_20;
  
  if (in_RDI->m_tree == (Tree *)0x0) {
    eVar4 = get_error_flags();
    if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
      trap_instruction();
    }
    Location::Location((Location *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                       in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    loc.super_LineCol.line = (size_t)in_stack_ffffffffffffff78;
    loc.super_LineCol.offset = (size_t)in_stack_ffffffffffffff70;
    loc.super_LineCol.col = (size_t)in_stack_ffffffffffffff80;
    loc.name = in_stack_ffffffffffffff88;
    error<32ul>(in_stack_ffffffffffffff60,loc);
    in_stack_ffffffffffffff10 = sStack_38;
    in_stack_ffffffffffffff18 = local_30;
    in_stack_ffffffffffffff20 = pTStack_28;
    in_stack_ffffffffffffff28 = local_20;
  }
  if ((in_RDI->m_id == 0xffffffffffffffff) || (bVar3 = is_seed(in_RDI), bVar3)) {
    memcpy(&stack0xffffffffffffff88,"check failed: (m_id != NONE && !is_seed())",0x2b);
    eVar4 = get_error_flags();
    if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
      trap_instruction();
    }
    p_Var1 = (in_RDI->m_tree->m_callbacks).m_error;
    Location::Location(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                       (size_t)in_stack_ffffffffffffff20,(size_t)in_stack_ffffffffffffff18,
                       in_stack_ffffffffffffff10);
    in_stack_ffffffffffffff28 = in_stack_ffffffffffffff80;
    in_stack_ffffffffffffff20 = in_stack_ffffffffffffff78;
    in_stack_ffffffffffffff18 = in_stack_ffffffffffffff70;
    LVar2.super_LineCol.line = tStack_98;
    LVar2.super_LineCol.offset = (size_t)in_stack_ffffffffffffff60;
    LVar2.super_LineCol.col = (size_t)in_stack_ffffffffffffff18;
    LVar2.name.str = (char *)in_stack_ffffffffffffff20;
    LVar2.name.len = (size_t)in_stack_ffffffffffffff28;
    (*p_Var1)(&stack0xffffffffffffff88,0x2b,LVar2,(in_RDI->m_tree->m_callbacks).m_user_data);
    in_stack_ffffffffffffff10 = tStack_98;
  }
  key_00.len = (size_t)in_stack_ffffffffffffff30;
  key_00.str = in_stack_ffffffffffffff28;
  Tree::_set_key(in_stack_ffffffffffffff20,(size_t)in_stack_ffffffffffffff18,key_00,
                 in_stack_ffffffffffffff10);
  return;
}

Assistant:

void set_key(csubstr key) { _C4RV(); m_tree->_set_key(m_id, key); }